

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverageClipper.cpp
# Opt level: O2

void countCoverage(string *filename)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  long lVar5;
  ostream *poVar6;
  runtime_error *this;
  size_type sStack_200;
  BamReader bamreader;
  pair<int,_int> local_1e8;
  size_type local_1e0;
  queue<std::pair<int,_int>,_std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  positions;
  BamAlignment alignment;
  int local_dc;
  
  BamTools::BamReader::BamReader(&bamreader);
  cVar1 = BamTools::BamReader::Open((string *)&bamreader);
  if (cVar1 == '\0') {
    BamTools::BamReader::GetFilename_abi_cxx11_();
    poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&alignment);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::string::~string((string *)&alignment);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Couldn\'t open Bamfile");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  BamTools::BamAlignment::BamAlignment(&alignment);
  std::queue<std::pair<int,int>,std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>>::
  queue<std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>,void>(&positions);
  bVar2 = true;
  sStack_200 = 0;
LAB_001036fa:
  do {
    local_1e0 = sStack_200;
    do {
      cVar1 = BamTools::BamReader::GetNextAlignment((BamAlignment *)&bamreader);
      if (cVar1 == '\0') {
        poVar6 = std::operator<<((ostream *)&std::cout,"Maximum depth: ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)local_1e0);
        std::endl<char,std::char_traits<char>>(poVar6);
        std::_Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Deque_base
                  ((_Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   &positions);
        BamTools::BamAlignment::~BamAlignment(&alignment);
        BamTools::BamReader::~BamReader(&bamreader);
        return;
      }
      if (bVar2) {
        lVar5 = BamTools::BamAlignment::GetEndPosition(SUB81(&alignment,0),false);
        local_1e8 = (pair<int,_int>)((ulong)(local_dc + 1) | lVar5 << 0x20);
        std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((deque<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&positions,
                   &local_1e8);
        bVar2 = false;
        sStack_200 = 1;
        goto LAB_001036fa;
      }
      iVar3 = BamTools::BamAlignment::GetEndPosition(SUB81(&alignment,0),false);
      while ((positions.c.
              super__Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur !=
              positions.c.
              super__Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur &&
             ((positions.c.
               super__Deque_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
               .super__Deque_impl_data._M_start._M_cur)->second <= local_dc))) {
        std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::pop_front
                  ((deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&positions);
      }
      local_1e8.second = iVar3;
      local_1e8.first = local_dc + 1;
      std::deque<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<std::pair<int,int>>
                ((deque<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&positions,
                 &local_1e8);
      sVar4 = std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                        ((deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         &positions);
    } while (sVar4 <= (ulong)(long)(int)sStack_200);
    sStack_200 = std::deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                           ((deque<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            &positions);
  } while( true );
}

Assistant:

void countCoverage(string filename) {
    BamTools::BamReader bamreader;
    if (not bamreader.Open(filename)) {
        cerr << bamreader.GetFilename() << endl;
        throw std::runtime_error("Couldn't open Bamfile");
    }
    BamTools::BamAlignment alignment;

    int currentStart =0;
    int currentEnd =0;
    int maxDepth =0;
    std::queue<std::pair<int,int>> positions;
    bool firstAlignment = true;

     while (bamreader.GetNextAlignment(alignment)){

        //Working with the first alignment
        if(firstAlignment){
            positions.push(std::make_pair((alignment.Position+1),alignment.GetEndPosition()));
            maxDepth = 1;
            firstAlignment = false;
            continue;
        }

        //For all alignments other than the first alignment

        //Assigning the positions
        currentStart = (alignment.Position+1);
        currentEnd = alignment.GetEndPosition();

        //cout<<"current start1: "<<currentStartPair1<<" end1: "<<currentEndPair1<<endl;

        while(!positions.empty()){
            //cout<<"start1: "<<firstMatePositions.front().first<<" end1: "<<firstMatePositions.front().second<<endl;
            int endPair1 = positions.front().second;
            if(currentStart>endPair1 ){
                //cout<<"pop"<<endl;
                positions.pop();
                continue;
            }
            break;
        }

        positions.push(std::make_pair(currentStart,currentEnd));

        if((positions.size())>maxDepth){
            maxDepth = positions.size();

        }
    }
     cout<<"Maximum depth: "<<maxDepth<<endl;

}